

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O3

int * Gia_ManFraigSelectReprs(Gia_Man_t *p,Gia_Man_t *pClp,int fVerbose,int *pFlopTypes)

{
  undefined1 *puVar1;
  uint uVar2;
  void *pvVar3;
  int *piVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  int *__s;
  undefined4 *__s_00;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint *puVar16;
  uint uVar17;
  size_t sVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  uint local_58;
  
  sVar18 = (long)p->nObjs << 2;
  pvVar3 = p->pManTime;
  __s = (int *)malloc(sVar18);
  memset(__s,0xff,sVar18);
  iVar10 = pClp->nObjs;
  sVar18 = (long)iVar10 * 4;
  __s_00 = (undefined4 *)malloc(sVar18);
  memset(__s_00,0xff,sVar18);
  if (pvVar3 == (void *)0x0) {
    __assert_fail("pManTime != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x1d0,"int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
  }
  uVar23 = 0;
  uVar15 = 0;
  if (1 < iVar10) {
    pGVar8 = pClp->pObjs;
    uVar15 = 0;
    uVar13 = 1;
    uVar23 = 0;
    do {
      pGVar8 = pGVar8 + 1;
      if ((-1 < (int)*(uint *)pGVar8 || (~*(uint *)pGVar8 & 0x1fffffff) == 0) &&
         (uVar22 = (ulong)(uint)pClp->pReprs[uVar13] & 0xfffffff,
         uVar13 != uVar22 && uVar22 != 0xfffffff)) {
        if ((int)uVar22 == 0) {
          uVar23 = (ulong)((int)uVar23 + 1);
        }
        else {
          uVar15 = (ulong)((int)uVar15 + 1);
        }
      }
      uVar13 = uVar13 + 1;
    } while ((long)iVar10 != uVar13);
  }
  if (fVerbose != 0) {
    printf("Computed %d const objects and %d other objects.\n",uVar23,uVar15);
  }
  Gia_ManCleanMark0(p);
  iVar10 = p->nRegs;
  iVar20 = p->vCos->nSize;
  iVar6 = Gia_ManRegBoxNum(p);
  uVar17 = iVar20 - (iVar6 + iVar10);
  pVVar9 = p->vCos;
  iVar10 = pVVar9->nSize;
  if ((int)uVar17 < iVar10 - p->nRegs) {
    uVar15 = (ulong)uVar17;
    do {
      if (((int)uVar17 < 0) || (iVar10 <= (int)uVar15)) goto LAB_0022ea29;
      iVar10 = pVVar9->pArray[uVar15];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_0022ea0a;
      pGVar8 = p->pObjs + iVar10;
      uVar23 = (ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff);
      if (((uint)*(ulong *)(pGVar8 + -uVar23) & 0x9fffffff) != 0x9fffffff) {
        __assert_fail("Gia_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                      ,0x1e6,"int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
      }
      *(ulong *)(pGVar8 + -uVar23) = *(ulong *)(pGVar8 + -uVar23) | 0x40000000;
      uVar15 = uVar15 + 1;
      pVVar9 = p->vCos;
      iVar10 = pVVar9->nSize;
    } while ((int)uVar15 < iVar10 - p->nRegs);
  }
  pVVar9 = Gia_ManComputeCarryOuts(p);
  uVar17 = pVVar9->nSize;
  if (0 < (long)(int)uVar17) {
    piVar4 = pVVar9->pArray;
    lVar14 = 0;
    do {
      iVar10 = piVar4[lVar14];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_0022ea0a;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar10].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      lVar14 = lVar14 + 1;
    } while ((int)uVar17 != lVar14);
  }
  if (fVerbose != 0) {
    uVar7 = Gia_ManRegBoxNum(p);
    Gia_ManNonRegBoxNum(p);
    printf("Fixed %d flop inputs and %d box/box connections (out of %d non-flop boxes).\n",
           (ulong)uVar7,(ulong)uVar17);
  }
  if (pVVar9->pArray != (int *)0x0) {
    free(pVVar9->pArray);
  }
  free(pVVar9);
  pFlopTypes[2] = 0;
  pFlopTypes[0] = 0;
  pFlopTypes[1] = 0;
  uVar15 = (ulong)(uint)pClp->nRegs;
  if (0 < pClp->nRegs) {
    pVVar9 = pClp->vCis;
    iVar10 = 0;
    iVar20 = 0;
    lVar14 = 0;
    do {
      iVar6 = pVVar9->nSize;
      uVar17 = iVar6 - (int)uVar15;
      uVar15 = (ulong)uVar17 + lVar14;
      iVar24 = (int)uVar15;
      if ((iVar24 < 0) || (iVar6 <= iVar24)) {
LAB_0022ea29:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar7 = pVVar9->pArray[uVar15 & 0xffffffff];
      if (((int)uVar7 < 0) || (pClp->nObjs <= (int)uVar7)) goto LAB_0022ea0a;
      if (pClp->pObjs == (Gia_Obj_t *)0x0) break;
      uVar15 = (ulong)(uint)pClp->pReprs[lVar14] & 0xfffffff;
      if (uVar15 != 0xfffffff) {
        uVar11 = (uint)uVar15;
        if ((uint)pClp->nObjs <= uVar11) goto LAB_0022ea0a;
        if (uVar11 != uVar7) {
          if (uVar11 == 0) {
            iVar10 = iVar10 + 1;
            *pFlopTypes = iVar10;
          }
          else {
            uVar5 = *(undefined8 *)(pClp->pObjs + uVar15);
            if ((((uint)uVar5 & 0x9fffffff) == 0x9fffffff) &&
               ((int)uVar17 <= (int)((uint)((ulong)uVar5 >> 0x20) & 0x1fffffff))) {
              iVar20 = iVar20 + 1;
              pFlopTypes[1] = iVar20;
            }
          }
        }
      }
      lVar14 = lVar14 + 1;
      uVar15 = (ulong)pClp->nRegs;
    } while (lVar14 < (long)uVar15);
  }
  *__s_00 = 0;
  Gia_ManSetPhase(pClp);
  uVar7 = p->nObjs;
  local_58 = 0;
  uVar17 = 0;
  if (1 < (int)uVar7) {
    pGVar8 = p->pObjs;
    puVar16 = &pGVar8[1].Value;
    uVar17 = 0;
    uVar15 = 1;
    local_58 = 0;
    do {
      uVar11 = (uint)*(ulong *)(puVar16 + -2);
      uVar23 = *(ulong *)(puVar16 + -2) & 0x1fffffff;
      if (-1 < (int)uVar11 || uVar23 == 0x1fffffff) {
        if ((uVar11 & 0x9fffffff) == 0x9fffffff) {
          if ((uVar11 >> 0x1e & 1) != 0) goto LAB_0022e981;
        }
        else if (((int)uVar11 < 0) || ((int)uVar23 == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                        ,0x209,"int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)")
          ;
        }
        uVar11 = *puVar16;
        if (uVar11 != 0xffffffff) {
          if ((int)uVar11 < 0) {
LAB_0022ea67:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar23 = (ulong)(uVar11 >> 1);
          uVar19 = (uint)pClp->pReprs[uVar23] & 0xfffffff;
          uVar13 = (ulong)uVar19;
          if (uVar19 == 0xfffffff) {
            uVar13 = uVar23;
          }
          uVar19 = __s_00[uVar13];
          uVar22 = (ulong)uVar19;
          if (uVar22 == 0xffffffff) {
            __s_00[uVar13] = (int)uVar15;
          }
          else {
            if (uVar7 <= uVar19) goto LAB_0022ea0a;
            uVar2 = pGVar8[uVar22].Value;
            if ((int)uVar2 < 0) goto LAB_0022ea67;
            uVar12 = uVar2 >> 1;
            uVar21 = (uint)pClp->pReprs[uVar12] & 0xfffffff;
            if (uVar21 == 0xfffffff) {
              uVar21 = uVar12;
            }
            if ((uint)uVar13 != uVar21) {
              __assert_fail("Gia_ObjReprSelf(pClp, Abc_Lit2Var(iLitClp)) == Gia_ObjReprSelf(pClp, Abc_Lit2Var(iLitClp2))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                            ,0x213,
                            "int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
            }
            if ((pClp->nObjs <= (int)(uVar11 >> 1)) || ((uint)pClp->nObjs <= uVar12))
            goto LAB_0022ea0a;
            __s[uVar15] = ((uint)((ulong)*(undefined8 *)(pClp->pObjs + uVar12) >> 0x3f) ^
                          (uint)((ulong)*(undefined8 *)(pClp->pObjs + uVar23) >> 0x3f) ^
                          (uVar11 ^ uVar2) & 1) + uVar19 * 2;
            if (uVar15 <= uVar22) {
              __assert_fail("Abc_Lit2Var(pReprs[i]) < i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                            ,0x218,
                            "int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
            }
            if (uVar22 == 0) {
              local_58 = local_58 + 1;
            }
            else {
              uVar17 = uVar17 + 1;
            }
          }
        }
      }
LAB_0022e981:
      uVar15 = uVar15 + 1;
      puVar16 = puVar16 + 3;
    } while (uVar7 != uVar15);
  }
  free(__s_00);
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      iVar10 = pVVar9->pArray[lVar14];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) {
LAB_0022ea0a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar10].field_0x3;
      *puVar1 = *puVar1 & 0xbf;
      lVar14 = lVar14 + 1;
      pVVar9 = p->vCis;
    } while (lVar14 < pVVar9->nSize);
  }
  if (fVerbose != 0) {
    printf("Found %d const objects and %d other objects.\n",(ulong)local_58,(ulong)uVar17);
  }
  return __s;
}

Assistant:

int * Gia_ManFraigSelectReprs( Gia_Man_t * p, Gia_Man_t * pClp, int fVerbose, int pFlopTypes[3] )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vCarryOuts;
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    int * pReprs   = ABC_FALLOC( int, Gia_ManObjNum(p) );
    int * pClp2Gia = ABC_FALLOC( int, Gia_ManObjNum(pClp) );
    int i, iLitClp, iLitClp2, iReprClp, fCompl;
    int nConsts = 0, nReprs = 0;
    assert( pManTime != NULL );
    // count the number of equivalent objects
    Gia_ManForEachObj1( pClp, pObj, i )
    {
        if ( Gia_ObjIsCo(pObj) )
            continue;
        if ( i == Gia_ObjReprSelf(pClp, i) )
            continue;
        if ( Gia_ObjReprSelf(pClp, i) == 0 )
            nConsts++;
        else
            nReprs++;
    }
    if ( fVerbose )
        printf( "Computed %d const objects and %d other objects.\n", nConsts, nReprs );
    nConsts = nReprs = 0;

    // mark flop input boxes
    Gia_ManCleanMark0( p );
    for ( i = Gia_ManPoNum(p) - Gia_ManRegBoxNum(p); i < Gia_ManPoNum(p); i++ )
    {
        pObj = Gia_ObjFanin0( Gia_ManPo(p, i) );
        assert( Gia_ObjIsCi(pObj) );
        pObj->fMark0 = 1;
    }
    // mark connects between last box inputs and first box outputs
    vCarryOuts = Gia_ManComputeCarryOuts( p );
    Gia_ManForEachObjVec( vCarryOuts, p, pObj, i )
        pObj->fMark0 = 1;
    if ( fVerbose )
        printf( "Fixed %d flop inputs and %d box/box connections (out of %d non-flop boxes).\n", 
            Gia_ManRegBoxNum(p), Vec_IntSize(vCarryOuts), Gia_ManNonRegBoxNum(p) );
    Vec_IntFree( vCarryOuts );

    // collect equivalent node info
    pFlopTypes[0] = pFlopTypes[1] = pFlopTypes[2] = 0;
    Gia_ManForEachRo( pClp, pObj, i )
    {
        Gia_Obj_t * pRepr = Gia_ObjReprObj(pClp, i);
        if ( pRepr && pRepr != pObj )
        {
            if ( pRepr == Gia_ManConst0(pClp) )
                pFlopTypes[0]++;
            else if ( Gia_ObjIsRo(pClp, pRepr) )
                pFlopTypes[1]++;
        }
    }

    // compute representatives
    pClp2Gia[0] = 0;
    Gia_ManSetPhase( pClp );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCo(pObj) )
            continue;
        if ( Gia_ObjIsCi(pObj) && pObj->fMark0 ) // skip CI pointed by CO
            continue;
        assert( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) );
        iLitClp = Gia_ObjValue(pObj);
        if ( iLitClp == -1 )
            continue;
        iReprClp = Gia_ObjReprSelf( pClp, Abc_Lit2Var(iLitClp) );
        if ( pClp2Gia[iReprClp] == -1 )
            pClp2Gia[iReprClp] = i;
        else
        { 
            iLitClp2 = Gia_ObjValue( Gia_ManObj(p, pClp2Gia[iReprClp]) );
            assert( Gia_ObjReprSelf(pClp, Abc_Lit2Var(iLitClp)) == Gia_ObjReprSelf(pClp, Abc_Lit2Var(iLitClp2)) );
            fCompl  = Abc_LitIsCompl(iLitClp) ^ Abc_LitIsCompl(iLitClp2);
            fCompl ^= Gia_ManObj(pClp, Abc_Lit2Var(iLitClp))->fPhase;
            fCompl ^= Gia_ManObj(pClp, Abc_Lit2Var(iLitClp2))->fPhase;
            pReprs[i] = Abc_Var2Lit( pClp2Gia[iReprClp], fCompl );
            assert( Abc_Lit2Var(pReprs[i]) < i );
            if ( pClp2Gia[iReprClp] == 0 )
                nConsts++;
            else
                nReprs++;
        }
    }
    ABC_FREE( pClp2Gia );
    Gia_ManForEachCi( p, pObj, i )
        pObj->fMark0 = 0;
    if ( fVerbose )
        printf( "Found %d const objects and %d other objects.\n", nConsts, nReprs );
    return pReprs;
}